

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O0

void copymaps(char *filepath)

{
  FILE *__stream;
  size_t __size;
  size_t rsz;
  char buffer [256];
  FILE *wf;
  FILE *rf;
  char newmapfile [256];
  char mapfile [16];
  char *filepath_local;
  
  builtin_strncpy(newmapfile + 0xf8,"/proc/se",8);
  snprintf((char *)&rf,0x100,"%s.maps",filepath);
  __stream = fopen(newmapfile + 0xf8,"r");
  if (__stream != (FILE *)0x0) {
    buffer._248_8_ = fopen((char *)&rf,"w");
    if ((FILE *)buffer._248_8_ != (FILE *)0x0) {
      while (__size = fread(&rsz,1,0x100,__stream), __size != 0) {
        fwrite(&rsz,__size,1,(FILE *)buffer._248_8_);
      }
      fclose((FILE *)buffer._248_8_);
    }
    fclose(__stream);
  }
  printf("Copy %s to %s\n",newmapfile + 0xf8,&rf);
  printf("Please use below command and try to find the memory leak line in your source file\n");
  printf("smtaddr2line.sh %s %s %s\n",filepath,&rf,
         "/ #one specific directory that contains current current process\'s excutable binary and linked shared libraies"
        );
  return;
}

Assistant:

void copymaps(char* filepath)
{
    char mapfile[] = "/proc/self/maps";
    char newmapfile[PATH_MAX];
    snprintf(newmapfile, sizeof(newmapfile), "%s.maps", filepath);
    FILE* rf = fopen(mapfile, "r");
    if (rf) {
        FILE* wf = fopen(newmapfile, "w");
        if (wf) {
            char buffer[256];
            size_t rsz;
            while (rsz = fread(buffer, 1, sizeof(buffer), rf))
                fwrite(buffer, rsz, 1, wf);
            fclose(wf);
        }
        fclose(rf);
    }
    SMTLOG("Copy %s to %s\n", mapfile, newmapfile);
    SMTLOG("Please use below command and try to find the memory leak line in your source file\n");
    SMTLOG("smtaddr2line.sh %s %s %s\n", filepath, newmapfile, "/ #one specific directory that contains current current process's excutable binary and linked shared libraies");
}